

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O3

void __thiscall
FIX::MemoryStore::get
          (MemoryStore *this,SEQNUM begin,SEQNUM end,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *messages)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(messages,(messages->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  p_Var1 = (this->m_messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var3 = &(this->m_messages)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var3->_M_header;
    do {
      if (*(ulong *)(p_Var1 + 1) >= begin) {
        p_Var2 = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[*(ulong *)(p_Var1 + 1) < begin];
    } while (p_Var1 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var3) && (*(ulong *)(p_Var2 + 1) <= begin)) {
      do {
        if (end < *(ulong *)(p_Var2 + 1)) {
          return;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(messages,(value_type *)&p_Var2[1]._M_parent);
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
  }
  return;
}

Assistant:

EXCEPT(IOException) {
  messages.clear();
  Messages::const_iterator find = m_messages.find(begin);
  for (; find != m_messages.end() && find->first <= end; ++find) {
    messages.push_back(find->second);
  }
}